

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_proto.cpp
# Opt level: O3

void caffe::UpgradeV0PaddingLayers(NetParameter *param,NetParameter *param_upgraded_pad)

{
  uint32 uVar1;
  string *psVar2;
  pointer pcVar3;
  int iVar4;
  Type *pTVar5;
  mapped_type_conflict1 *pmVar6;
  Type *from;
  Type *pTVar7;
  iterator iVar8;
  ostream *this;
  V0LayerParameter *pVVar9;
  Type *pTVar10;
  V0LayerParameter *pVVar11;
  LogMessage *other;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  blob_name_to_last_top_idx;
  LogFinisher local_f1;
  NetParameter *local_f0;
  RepeatedPtrFieldBase *local_e8;
  RepeatedPtrFieldBase *local_e0;
  ulong local_d8;
  NetParameter *local_d0;
  V0LayerParameter *local_c8;
  RepeatedPtrFieldBase *local_c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_b8;
  long *local_88 [2];
  long local_78 [2];
  LogMessage local_68;
  
  NetParameter::Clear(param_upgraded_pad);
  NetParameter::CopyFrom(param_upgraded_pad,param);
  local_e8 = &(param_upgraded_pad->layers_).super_RepeatedPtrFieldBase;
  local_d0 = param_upgraded_pad;
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>(local_e8);
  local_b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b8._M_impl.super__Rb_tree_header._M_header;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  iVar12 = 0;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f0 = param;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < (param->input_).super_RepeatedPtrFieldBase.current_size_) {
    do {
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(param->input_).super_RepeatedPtrFieldBase,iVar12);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)&local_b8,pTVar5);
      *pmVar6 = -1;
      iVar12 = iVar12 + 1;
    } while (iVar12 < (local_f0->input_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (local_f0->layers_).super_RepeatedPtrFieldBase.current_size_) {
    local_e0 = &(local_f0->layers_).super_RepeatedPtrFieldBase;
    uVar14 = 0;
    do {
      local_d8 = uVar14;
      from = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>
                       (local_e0,(int)uVar14);
      local_c8 = from->layer_;
      if (local_c8 == (V0LayerParameter *)0x0) {
        local_c8 = (V0LayerParameter *)&_V0LayerParameter_default_instance_;
      }
      iVar12 = std::__cxx11::string::compare((char *)(local_c8->type_).ptr_);
      if (iVar12 != 0) {
        pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Add<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>
                           (local_e8,(Type *)0x0);
        V1LayerParameter::CopyFrom(pTVar7,from);
      }
      if (0 < (from->bottom_).super_RepeatedPtrFieldBase.current_size_) {
        local_c0 = &(from->bottom_).super_RepeatedPtrFieldBase;
        iVar12 = 0;
        do {
          pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (local_c0,iVar12);
          iVar8 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::find(&local_b8,pTVar5);
          if ((_Rb_tree_header *)iVar8._M_node == &local_b8._M_impl.super__Rb_tree_header) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Unknown blob input ",0x13);
            this = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(pTVar5->_M_dataplus)._M_p,
                              pTVar5->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(this," to layer ",10);
            std::ostream::operator<<((ostream *)this,iVar12);
          }
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                 *)&local_b8,pTVar5);
          if (*pmVar6 != -1) {
            pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>
                               (local_e0,*pmVar6);
            pVVar9 = pTVar7->layer_;
            if (pVVar9 == (V0LayerParameter *)0x0) {
              pVVar9 = (V0LayerParameter *)&_V0LayerParameter_default_instance_;
            }
            iVar4 = std::__cxx11::string::compare((char *)(pVVar9->type_).ptr_);
            if (iVar4 == 0) {
              psVar2 = (local_c8->type_).ptr_;
              pcVar3 = (psVar2->_M_dataplus)._M_p;
              local_88[0] = local_78;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_88,pcVar3,pcVar3 + psVar2->_M_string_length);
              if (local_88[0] != local_78) {
                operator_delete(local_88[0],local_78[0] + 1);
              }
              iVar4 = (local_d0->layers_).super_RepeatedPtrFieldBase.current_size_ + -1;
              pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                        Mutable<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>
                                  (local_e8,iVar4);
              *(byte *)(pTVar10->_has_bits_).has_bits_ =
                   (byte)(pTVar10->_has_bits_).has_bits_[0] | 2;
              pVVar9 = pTVar10->layer_;
              if (pVVar9 == (V0LayerParameter *)0x0) {
                pVVar9 = (V0LayerParameter *)operator_new(0x100);
                V0LayerParameter::V0LayerParameter(pVVar9);
                pTVar10->layer_ = pVVar9;
              }
              pVVar11 = pTVar7->layer_;
              if (pVVar11 == (V0LayerParameter *)0x0) {
                pVVar11 = (V0LayerParameter *)&_V0LayerParameter_default_instance_;
              }
              uVar1 = pVVar11->pad_;
              (pVVar9->_has_bits_).has_bits_[0] = (pVVar9->_has_bits_).has_bits_[0] | 0x200;
              pVVar9->pad_ = uVar1;
              pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                        Mutable<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>
                                  (local_e8,iVar4);
              if ((pTVar7->bottom_).super_RepeatedPtrFieldBase.current_size_ < 1) {
                google::protobuf::internal::LogMessage::LogMessage
                          (&local_68,LOGLEVEL_DFATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                           ,0x5ca);
                other = google::protobuf::internal::LogMessage::operator<<
                                  (&local_68,"CHECK failed: (index) < (current_size_): ");
                google::protobuf::internal::LogFinisher::operator=(&local_f1,other);
                google::protobuf::internal::LogMessage::~LogMessage(&local_68);
              }
              pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
                       Mutable<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                 (&(pTVar10->bottom_).super_RepeatedPtrFieldBase,iVar12);
              std::__cxx11::string::_M_assign((string *)pTVar5);
            }
          }
          iVar12 = iVar12 + 1;
        } while (iVar12 < (from->bottom_).super_RepeatedPtrFieldBase.current_size_);
      }
      if (0 < (from->top_).super_RepeatedPtrFieldBase.current_size_) {
        iVar12 = 0;
        do {
          pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&(from->top_).super_RepeatedPtrFieldBase,iVar12);
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                 *)&local_b8,pTVar5);
          *pmVar6 = (mapped_type_conflict1)local_d8;
          iVar12 = iVar12 + 1;
        } while (iVar12 < (from->top_).super_RepeatedPtrFieldBase.current_size_);
      }
      uVar13 = (int)local_d8 + 1;
      uVar14 = (ulong)uVar13;
    } while ((int)uVar13 < (local_f0->layers_).super_RepeatedPtrFieldBase.current_size_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_b8);
  return;
}

Assistant:

void UpgradeV0PaddingLayers(const NetParameter& param,
                            NetParameter* param_upgraded_pad) {
  // Copy everything other than the layers from the original param.
  param_upgraded_pad->Clear();
  param_upgraded_pad->CopyFrom(param);
  param_upgraded_pad->clear_layers();
  // Figure out which layer each bottom blob comes from.
  map<string, int> blob_name_to_last_top_idx;
  for (int i = 0; i < param.input_size(); ++i) {
    const string& blob_name = param.input(i);
    blob_name_to_last_top_idx[blob_name] = -1;
  }
  for (int i = 0; i < param.layers_size(); ++i) {
    const V1LayerParameter& layer_connection = param.layers(i);
    const V0LayerParameter& layer_param = layer_connection.layer();
    // Add the layer to the new net, unless it's a padding layer.
    if (layer_param.type() != "padding") {
      param_upgraded_pad->add_layers()->CopyFrom(layer_connection);
    }
    for (int j = 0; j < layer_connection.bottom_size(); ++j) {
      const string& blob_name = layer_connection.bottom(j);
      if (blob_name_to_last_top_idx.find(blob_name) ==
          blob_name_to_last_top_idx.end()) {
        LOG(FATAL) << "Unknown blob input " << blob_name << " to layer " << j;
      }
      const int top_idx = blob_name_to_last_top_idx[blob_name];
      if (top_idx == -1) {
        continue;
      }
      const V1LayerParameter& source_layer = param.layers(top_idx);
      if (source_layer.layer().type() == "padding") {
        // This layer has a padding layer as input -- check that it is a conv
        // layer or a pooling layer and takes only one input.  Also check that
        // the padding layer input has only one input and one output.  Other
        // cases have undefined behavior in Caffe.
        CHECK((layer_param.type() == "conv") || (layer_param.type() == "pool"))
            << "Padding layer input to "
            "non-convolutional / non-pooling layer type "
            << layer_param.type();
        CHECK_EQ(layer_connection.bottom_size(), 1)
            << "Conv Layer takes a single blob as input.";
        CHECK_EQ(source_layer.bottom_size(), 1)
            << "Padding Layer takes a single blob as input.";
        CHECK_EQ(source_layer.top_size(), 1)
            << "Padding Layer produces a single blob as output.";
        int layer_index = param_upgraded_pad->layers_size() - 1;
        param_upgraded_pad->mutable_layers(layer_index)->mutable_layer()
            ->set_pad(source_layer.layer().pad());
        param_upgraded_pad->mutable_layers(layer_index)
            ->set_bottom(j, source_layer.bottom(0));
      }
    }
    for (int j = 0; j < layer_connection.top_size(); ++j) {
      const string& blob_name = layer_connection.top(j);
      blob_name_to_last_top_idx[blob_name] = i;
    }
  }
}